

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

atomic<unsigned_int> * __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::data_t::operator[](data_t *this,size_t index)

{
  atomic<std::array<std::atomic<unsigned_int>,_128UL>_*> *paVar1;
  bool bVar2;
  __pointer_type paVar3;
  array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL> *__s;
  piece_t *ptr;
  piece_t *piece;
  memory_order in_stack_000000dc;
  __pointer_type in_stack_000000e0;
  __pointer_type *in_stack_000000e8;
  atomic<std::array<std::atomic<unsigned_int>,_128UL>_*> *in_stack_000000f0;
  array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL>
  *in_stack_ffffffffffffffa8;
  array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL>
  *in_stack_ffffffffffffffb0;
  array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL> *paVar4;
  array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL> *local_38;
  reference local_8;
  
  std::array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL>::operator[]
            (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
  paVar3 = std::atomic::operator_cast_to_array_
                     ((atomic<std::array<std::atomic<unsigned_int>,_128UL>_*> *)0x25a29e);
  if (paVar3 == (__pointer_type)0x0) {
    __s = (array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL> *)
          operator_new(0x200);
    memset(__s,0,0x200);
    paVar1 = __s->_M_elems;
    paVar4 = __s;
    do {
      local_38 = paVar4;
      std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)0x25a2f5);
      paVar4 = (array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL> *)
               ((long)&local_38->_M_elems[0]._M_b._M_p + 4);
    } while (paVar4 != (array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL> *)
                       (paVar1 + 0x40));
    paVar4 = __s;
    std::array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL>::operator[]
              (local_38,(size_type)in_stack_ffffffffffffffa8);
    bVar2 = std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>::compare_exchange_strong
                      (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000dc);
    if ((!bVar2) &&
       (in_stack_ffffffffffffffa8 = __s,
       __s != (array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL> *)0x0)) {
      operator_delete(__s,0x200);
      in_stack_ffffffffffffffa8 = __s;
    }
    std::array<std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>,_128UL>::operator[]
              (local_38,(size_type)in_stack_ffffffffffffffa8);
    std::atomic<std::array<std::atomic<unsigned_int>,_128UL>_*>::load
              (paVar4->_M_elems,(memory_order)((ulong)local_38 >> 0x20));
    local_8 = std::array<std::atomic<unsigned_int>,_128UL>::operator[]
                        ((array<std::atomic<unsigned_int>,_128UL> *)local_38,
                         (size_type)in_stack_ffffffffffffffa8);
  }
  else {
    local_8 = std::array<std::atomic<unsigned_int>,_128UL>::operator[]
                        ((array<std::atomic<unsigned_int>,_128UL> *)in_stack_ffffffffffffffb0,
                         (size_type)in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

std::atomic<uint_type>& operator[](std::size_t index) {
      piece_t* piece = arr[index / piece_size];
      if (piece == nullptr) {
        auto ptr = new piece_t{};
        if (!arr[index / piece_size].compare_exchange_strong(piece, ptr)) {
          delete ptr;
        }
        return (*arr[index / piece_size].load())[index % piece_size];
      }
      else {
        return (*piece)[index % piece_size];
      }
    }